

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O1

int ECDSA_SIG_to_bytes(uint8_t **out_bytes,size_t *out_len,ECDSA_SIG *sig)

{
  int iVar1;
  CBB cbb;
  CBB local_50;
  
  CBB_zero(&local_50);
  iVar1 = CBB_init(&local_50,0);
  if (((iVar1 != 0) && (iVar1 = ECDSA_SIG_marshal(&local_50,sig), iVar1 != 0)) &&
     (iVar1 = CBB_finish(&local_50,out_bytes,out_len), iVar1 != 0)) {
    return 1;
  }
  ERR_put_error(0x1a,0,0x69,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_asn1.cc"
                ,0x11d);
  CBB_cleanup(&local_50);
  return 0;
}

Assistant:

int ECDSA_SIG_to_bytes(uint8_t **out_bytes, size_t *out_len,
                       const ECDSA_SIG *sig) {
  CBB cbb;
  CBB_zero(&cbb);
  if (!CBB_init(&cbb, 0) || !ECDSA_SIG_marshal(&cbb, sig) ||
      !CBB_finish(&cbb, out_bytes, out_len)) {
    OPENSSL_PUT_ERROR(ECDSA, ECDSA_R_ENCODE_ERROR);
    CBB_cleanup(&cbb);
    return 0;
  }
  return 1;
}